

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O3

Formula * __thiscall
Kernel::PolarityAwareFormulaTransformer::transformWithPolarity
          (PolarityAwareFormulaTransformer *this,Formula *f,int polarity)

{
  Formula *pFVar1;
  
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (*(DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> **)
              &this->_varSorts);
  SortHelper::collectVariableSorts
            (f,*(DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> **)
                &this->_varSorts,false);
  this->_polarity = polarity;
  pFVar1 = FormulaTransformer::apply(&this->super_FormulaTransformer,f);
  return pFVar1;
}

Assistant:

Formula* PolarityAwareFormulaTransformer::transformWithPolarity(Formula* f, int polarity)
{
  ASS_REP(polarity==0 || polarity==1 || polarity==-1, polarity);

  _varSorts->reset();
  SortHelper::collectVariableSorts(f, *_varSorts);

  _polarity = polarity;
  return FormulaTransformer::transform(f);
}